

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int main(int argc,char **argv)

{
  GLFWwindow *handle;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2200b,0x36002);
  glfwWindowHint(0x22001,0x30001);
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,2);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  handle = glfwCreateWindow(300,300,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    glClearColor(0x3ecccccd,0x3ecccccd,0x3ecccccd,0x3f800000);
    glClear(0x4100);
    glfwSwapBuffers(handle);
    glfwDestroyWindow(handle);
    glfwTerminate();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
   glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
   glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_API);
   glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
   glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
   glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
   glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

   GLFWwindow* window;
   window = glfwCreateWindow(300, 300, argv[0], NULL, NULL);
   if (!window) {
       return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   glClearColor(0.4, 0.4, 0.4, 1.0);
   glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
   glfwSwapBuffers(window);

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}